

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void * icu_63::ZNames::createTimeZoneAndPutInCache
                 (UHashtable *cache,UChar **names,UnicodeString *tzID,UErrorCode *status)

{
  UChar *pUVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  bool bVar6;
  undefined4 uVar7;
  UnicodeString *__src;
  void *__dest;
  UChar *key;
  undefined8 *value;
  size_t s;
  UnicodeString *name;
  UnicodeString locationNameUniStr;
  
  if (U_ZERO_ERROR < *status) {
    return (void *)0x0;
  }
  if (*names != (UChar *)0x0) {
    __dest = (void *)0x0;
    __src = (UnicodeString *)names;
    goto LAB_0020c4ce;
  }
  name = &locationNameUniStr;
  locationNameUniStr.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003b0268;
  locationNameUniStr.fUnion.fStackFields.fLengthAndFlags = 2;
  TimeZoneNamesImpl::getDefaultExemplarLocationName(tzID,name);
  uVar7 = locationNameUniStr.fUnion.fFields.fLength;
  if (-1 < locationNameUniStr.fUnion.fStackFields.fLengthAndFlags) {
    uVar7 = (int)locationNameUniStr.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  bVar6 = true;
  __src = name;
  if ((int)uVar7 < 1) {
LAB_0020c4b8:
    __dest = (void *)0x0;
  }
  else {
    __src = (UnicodeString *)UnicodeString::getTerminatedBuffer(&locationNameUniStr);
    if (-1 < locationNameUniStr.fUnion.fStackFields.fLengthAndFlags) {
      locationNameUniStr.fUnion.fFields.fLength =
           (int)locationNameUniStr.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    s = (size_t)(locationNameUniStr.fUnion.fFields.fLength * 2 + 2);
    __dest = uprv_malloc_63(s);
    if (__dest == (void *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      bVar6 = false;
      __src = name;
      goto LAB_0020c4b8;
    }
    memcpy(__dest,__src,s);
    bVar6 = true;
  }
  UnicodeString::~UnicodeString(&locationNameUniStr);
  if (!bVar6) {
    return (void *)0x0;
  }
LAB_0020c4ce:
  key = ZoneMeta::findTimeZoneID(tzID);
  value = (undefined8 *)UMemory::operator_new((UMemory *)0x40,(size_t)__src);
  if (value == (undefined8 *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return (void *)0x0;
  }
  *(undefined1 *)(value + 7) = 0;
  pUVar1 = names[1];
  pUVar2 = names[2];
  pUVar3 = names[3];
  pUVar4 = names[4];
  pUVar5 = names[5];
  *value = *names;
  value[1] = pUVar1;
  value[2] = pUVar2;
  value[3] = pUVar3;
  value[4] = pUVar4;
  value[5] = pUVar5;
  value[6] = names[6];
  if (__dest != (void *)0x0) {
    *value = __dest;
  }
  *(bool *)((long)value + 0x39) = __dest != (void *)0x0;
  uhash_put_63(cache,key,value,status);
  return value;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }